

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O0

Scalar __thiscall
Eigen::DenseBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
redux<Eigen::internal::scalar_max_op<double,double,0>>
          (DenseBase<Eigen::Matrix<double,_1,1,0,_1,1>> *this,scalar_max_op<double,_double,_0> *func
          )

{
  bool bVar1;
  ThisEvaluator func_00;
  Index IVar2;
  Matrix<double,__1,_1,_0,__1,_1> *pMVar3;
  Scalar SVar4;
  redux_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_20;
  ThisEvaluator thisEval;
  scalar_max_op<double,_double,_0> *func_local;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this_local;
  
  thisEval.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data =
       (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
       (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)func;
  IVar2 = EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::rows
                    ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this);
  bVar1 = false;
  if (0 < IVar2) {
    IVar2 = EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::cols
                      ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this);
    bVar1 = false;
    if (0 < IVar2) {
      bVar1 = true;
    }
  }
  if (!bVar1) {
    __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/Redux.h"
                  ,0x19b,
                  "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::redux(const Func &) const [Derived = Eigen::Matrix<double, -1, 1>, BinaryOp = Eigen::internal::scalar_max_op<double>]"
                 );
  }
  pMVar3 = EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::derived
                     ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this);
  internal::redux_evaluator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::redux_evaluator
            (&local_20,pMVar3);
  func_00 = thisEval;
  pMVar3 = EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::derived
                     ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this);
  SVar4 = internal::
          redux_impl<Eigen::internal::scalar_max_op<double,double,0>,Eigen::internal::redux_evaluator<Eigen::Matrix<double,-1,1,0,-1,1>>,3,0>
          ::run<Eigen::Matrix<double,_1,1,0,_1,1>>
                    (&local_20,
                     (scalar_max_op<double,_double,_0> *)
                     func_00.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     .m_d.data,pMVar3);
  internal::redux_evaluator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~redux_evaluator(&local_20);
  return SVar4;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE typename internal::traits<Derived>::Scalar
DenseBase<Derived>::redux(const Func& func) const
{
  eigen_assert(this->rows()>0 && this->cols()>0 && "you are using an empty matrix");

  typedef typename internal::redux_evaluator<Derived> ThisEvaluator;
  ThisEvaluator thisEval(derived());

  // The initial expression is passed to the reducer as an additional argument instead of
  // passing it as a member of redux_evaluator to help  
  return internal::redux_impl<Func, ThisEvaluator>::run(thisEval, func, derived());
}